

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O0

int mpt_data_convert_uint16(uint16_t *from,mpt_type_t type,void *dest)

{
  char cVar1;
  undefined1 uVar2;
  ushort **ppuVar3;
  iovec *vec;
  uint16_t val;
  void *dest_local;
  mpt_type_t type_local;
  uint16_t *from_local;
  
  vec._6_2_ = 0;
  if (from != (uint16_t *)0x0) {
    vec._6_2_ = *from;
  }
  dest_local = (void *)type;
  if (type == 0x6c) {
    cVar1 = mpt_type_int(8);
    dest_local = (void *)(long)cVar1;
  }
  uVar2 = (undefined1)vec._6_2_;
  switch(dest_local) {
  case (void *)0x51:
    if (dest != (void *)0x0) {
      *(uint16_t **)dest = from;
      *(undefined8 *)((long)dest + 8) = 2;
    }
    from_local._4_4_ = -0x10;
    break;
  default:
    from_local._4_4_ = -3;
    break;
  case (void *)0x62:
    if (vec._6_2_ < 0x80) {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    else {
      from_local._4_4_ = -2;
    }
    break;
  case (void *)0x63:
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)(uint)vec._6_2_] & 0x8000) == 0) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    break;
  case (void *)0x64:
    if (dest != (void *)0x0) {
      *(double *)dest = (double)vec._6_2_;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x65:
    *(longdouble *)dest = (longdouble)vec._6_2_;
    from_local._4_4_ = 0x10;
    break;
  case (void *)0x66:
    if (dest != (void *)0x0) {
      *(float *)dest = (float)vec._6_2_;
    }
    from_local._4_4_ = 4;
    break;
  case (void *)0x68:
    if (0x7fff < vec._6_2_) {
      return -2;
    }
  case (void *)0x71:
    if (dest != (void *)0x0) {
      *(uint16_t *)dest = vec._6_2_;
    }
    from_local._4_4_ = 2;
    break;
  case (void *)0x69:
  case (void *)0x75:
    if (dest != (void *)0x0) {
      *(uint *)dest = (uint)vec._6_2_;
    }
    from_local._4_4_ = 4;
    break;
  case (void *)0x74:
  case (void *)0x78:
    if (dest != (void *)0x0) {
      *(ulong *)dest = (ulong)vec._6_2_;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x79:
    if (vec._6_2_ < 0x100) {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    else {
      from_local._4_4_ = -2;
    }
  }
  return from_local._4_4_;
}

Assistant:

extern int mpt_data_convert_uint16(const uint16_t *from, MPT_TYPE(type) type, void *dest)
{
	uint16_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'b':
			if (val > INT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int8_t *) dest) = val;
			return sizeof(char);
		case 'y':
			if (val > UINT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint8_t *) dest) = val;
			return sizeof(uint8_t);
		case 'h':
			if (val > INT16_MAX) return MPT_ERROR(BadValue);
			/* fall through */
		case 'q':
			if (dest) *((uint16_t *) dest) = val;
			return sizeof(uint16_t);
		case 'u':
		case 'i':
			if (dest) *((int32_t *) dest) = val;
			return sizeof(int32_t);
		case 't':
		case 'x':
			if (dest) *((int64_t *) dest) = val;
			return sizeof(int64_t);
		
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e': *((long double *) dest) = val;
			return sizeof(long double);
#endif
		case MPT_type_toVector('q'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
	return sizeof(*from);
}